

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_info.c
# Opt level: O3

int readline(char *allbuf,int level,char *linebuf)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = strlen(allbuf);
  if (level < (int)sVar1) {
    lVar2 = 0;
    do {
      if ((allbuf[lVar2 + level] == '\r') && (allbuf[lVar2 + (long)level + 1] == '\n')) {
        return level + (int)lVar2 + 2;
      }
      linebuf[lVar2] = allbuf[lVar2 + level];
      lVar2 = lVar2 + 1;
    } while ((int)sVar1 - level != (int)lVar2);
  }
  return -1;
}

Assistant:

int readline(char* allbuf,int level,char* linebuf){
    int len = strlen(allbuf);
    for (;level<len;++level)
    {
        if(allbuf[level]=='\r' && allbuf[level+1]=='\n')
            return level+2;
        else
            *(linebuf++) = allbuf[level];
    }
    return -1;
}